

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int incomplete_type_p(c2m_ctx_t c2m_ctx,type *type)

{
  check_ctx *pcVar1;
  node_t_conflict pnVar2;
  type *type_00;
  int iVar3;
  node_t_conflict pnVar4;
  bool bVar5;
  bool local_4c;
  bool local_4b;
  bool local_4a;
  arr_type *arr_type;
  node_t_conflict n;
  node_t_conflict scope;
  check_ctx_t check_ctx;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  pcVar1 = c2m_ctx->check_ctx;
  switch(type->mode) {
  case TM_BASIC:
    c2m_ctx_local._4_4_ = (uint)((type->u).basic_type == TP_VOID);
    break;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION:
    pnVar2 = (type->u).tag_type;
    pnVar4 = DLIST_node_t_el(&(pnVar2->u).ops,1);
    if (pnVar4->code == N_IGNORE) {
      c2m_ctx_local._4_4_ = 1;
    }
    else {
      n = pcVar1->curr_scope;
      while( true ) {
        bVar5 = false;
        if ((n != (node_t_conflict)0x0) && (bVar5 = false, n != c2m_ctx->top_scope)) {
          bVar5 = n != pnVar2;
        }
        if (!bVar5) break;
        n = *(node_t_conflict *)((long)n->attr + 0x20);
      }
      c2m_ctx_local._4_4_ = (uint)(n == pnVar2);
    }
    break;
  case TM_PTR:
    c2m_ctx_local._4_4_ = 0;
    break;
  case TM_ARR:
    local_4a = true;
    if (((type->u).arr_type)->size->code != N_IGNORE) {
      iVar3 = incomplete_type_p(c2m_ctx,((type->u).arr_type)->el_type);
      local_4a = iVar3 != 0;
    }
    c2m_ctx_local._4_4_ = (uint)local_4a;
    break;
  case TM_FUNC:
    type_00 = ((type->u).ptr_type)->arr_type;
    local_4b = true;
    if (type_00 != (type *)0x0) {
      iVar3 = void_type_p(type_00);
      local_4c = false;
      if (iVar3 == 0) {
        iVar3 = incomplete_type_p(c2m_ctx,type_00);
        local_4c = iVar3 != 0;
      }
      local_4b = local_4c;
    }
    c2m_ctx_local._4_4_ = (uint)local_4b;
    break;
  default:
    c2m_ctx_local._4_4_ = 0;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int incomplete_type_p (c2m_ctx_t c2m_ctx, struct type *type) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;

  switch (type->mode) {
  case TM_BASIC: return type->u.basic_type == TP_VOID;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION: {
    node_t scope, n = type->u.tag_type;

    if (NL_EL (n->u.ops, 1)->code == N_IGNORE) return TRUE;
    for (scope = curr_scope; scope != NULL && scope != top_scope && scope != n;
         scope = ((struct node_scope *) scope->attr)->scope)
      ;
    return scope == n;
  }
  case TM_PTR: return FALSE;
  case TM_ARR: {
    struct arr_type *arr_type = type->u.arr_type;

    return (arr_type->size->code == N_IGNORE || incomplete_type_p (c2m_ctx, arr_type->el_type));
  }
  case TM_FUNC:
    return ((type = type->u.func_type->ret_type) == NULL
            || (!void_type_p (type) && incomplete_type_p (c2m_ctx, type)));
  default: return FALSE;
  }
}